

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

size_t __thiscall
Disa::Adjacency_Graph<false>::degree(Adjacency_Graph<false> *this,size_t *i_vertex)

{
  source_location *psVar1;
  value_type vVar2;
  source_location *location;
  ostream *poVar3;
  const_reference pvVar4;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unsigned_long *local_18;
  size_t *i_vertex_local;
  Adjacency_Graph<false> *this_local;
  
  psVar1 = (source_location *)*i_vertex;
  local_18 = i_vertex;
  i_vertex_local = (size_t *)this;
  location = (source_location *)size_vertex(this);
  if (location <= psVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001df328;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    std::__cxx11::to_string(&local_f0,*local_18);
    std::operator+(&local_d0,"Vertex index ",&local_f0);
    std::operator+(&local_b0,&local_d0," not in range [0, ");
    std::__cxx11::to_string(&local_110,*local_18);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,").");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->offset,*local_18 + 1);
  vVar2 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->offset,*local_18);
  return vVar2 - *pvVar4;
}

Assistant:

[[nodiscard]] inline std::size_t degree(const std::size_t& i_vertex) const {
    ASSERT_DEBUG(i_vertex < size_vertex(),
                 "Vertex index " + std::to_string(i_vertex) + " not in range [0, " + std::to_string(i_vertex) + ").");
    return offset[i_vertex + 1] - offset[i_vertex];
  }